

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

int nhdp_domain_mpr_add(nhdp_domain_mpr *mpr)

{
  list_entity *plVar1;
  int iVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_domain *domain;
  nhdp_domain_mpr *mpr_local;
  
  (mpr->_node).key = mpr->name;
  iVar2 = avl_insert(&_domain_mprs,&mpr->_node);
  plVar1 = _domain_list.next;
  if (iVar2 == 0) {
    for (; __tempptr = plVar1 + -0x2a, plVar1->prev != _domain_list.prev; plVar1 = plVar1->next) {
      if ((nhdp_domain_mpr *)plVar1[-0x28].prev == &_everyone_mprs) {
        _apply_mpr((nhdp_domain *)__tempptr,(char *)(plVar1 + -0x29),*(uint8_t *)&plVar1[-0x27].next
                  );
      }
    }
    if (_flooding_domain.mpr == &_everyone_mprs) {
      _apply_mpr(&_flooding_domain,_flooding_domain.mpr_name,_flooding_domain.local_willingness);
    }
    mpr_local._4_4_ = 0;
  }
  else {
    mpr_local._4_4_ = -1;
  }
  return mpr_local._4_4_;
}

Assistant:

int
nhdp_domain_mpr_add(struct nhdp_domain_mpr *mpr) {
  struct nhdp_domain *domain;

  /* initialize key */
  mpr->_node.key = mpr->name;

  if (avl_insert(&_domain_mprs, &mpr->_node)) {
    return -1;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->mpr == &_everyone_mprs) {
      _apply_mpr(domain, domain->mpr_name, domain->local_willingness);
    }
  }
  if (_flooding_domain.mpr == &_everyone_mprs) {
    _apply_mpr(&_flooding_domain, _flooding_domain.mpr_name, _flooding_domain.local_willingness);
  }
  return 0;
}